

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

xmlChar * xmlDictExists(xmlDictPtr dict,xmlChar *name,int len)

{
  uint32_t uVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  xmlDictEntryPtr local_68;
  xmlDictEntryPtr local_60;
  _xmlDictEntry *local_58;
  xmlDictEntryPtr tmp;
  unsigned_long skey;
  _xmlDictEntry *p_Stack_40;
  uint l;
  xmlDictEntryPtr insert;
  unsigned_long okey;
  unsigned_long key;
  int len_local;
  xmlChar *name_local;
  xmlDictPtr dict_local;
  
  if ((dict != (xmlDictPtr)0x0) && (name != (xmlChar *)0x0)) {
    skey._4_4_ = len;
    if (len < 0) {
      sVar3 = strlen((char *)name);
      skey._4_4_ = (uint)sVar3;
    }
    if (((dict->limit == 0) || ((ulong)skey._4_4_ < dict->limit)) && (skey._4_4_ < 0x40000000)) {
      if (dict->size == 0x80) {
        local_60 = (xmlDictEntryPtr)xmlDictComputeFastKey(name,skey._4_4_,dict->seed);
      }
      else {
        uVar1 = xmlDictComputeBigKey(name,skey._4_4_,dict->seed);
        local_60 = (xmlDictEntryPtr)(ulong)uVar1;
      }
      uVar4 = (ulong)local_60 % dict->size;
      if (dict->dict[uVar4].valid != 0) {
        for (p_Stack_40 = dict->dict + uVar4; p_Stack_40->next != (_xmlDictEntry *)0x0;
            p_Stack_40 = p_Stack_40->next) {
          if ((((xmlDictEntryPtr)p_Stack_40->okey == local_60) && (p_Stack_40->len == skey._4_4_))
             && (iVar2 = memcmp(p_Stack_40->name,name,(ulong)skey._4_4_), iVar2 == 0)) {
            return p_Stack_40->name;
          }
        }
        if ((((xmlDictEntryPtr)p_Stack_40->okey == local_60) && (p_Stack_40->len == skey._4_4_)) &&
           (iVar2 = memcmp(p_Stack_40->name,name,(ulong)skey._4_4_), iVar2 == 0)) {
          return p_Stack_40->name;
        }
      }
      if (dict->subdict != (_xmlDict *)0x0) {
        if (((dict->size == 0x80) && (dict->subdict->size != 0x80)) ||
           ((dict->size != 0x80 && (dict->subdict->size == 0x80)))) {
          if (dict->subdict->size == 0x80) {
            local_68 = (xmlDictEntryPtr)xmlDictComputeFastKey(name,skey._4_4_,dict->subdict->seed);
          }
          else {
            uVar1 = xmlDictComputeBigKey(name,skey._4_4_,dict->subdict->seed);
            local_68 = (xmlDictEntryPtr)(ulong)uVar1;
          }
          tmp = local_68;
        }
        else {
          tmp = local_60;
        }
        uVar4 = (ulong)tmp % dict->subdict->size;
        if (dict->subdict->dict[uVar4].valid != 0) {
          for (local_58 = dict->subdict->dict + uVar4; local_58->next != (_xmlDictEntry *)0x0;
              local_58 = local_58->next) {
            if ((((xmlDictEntryPtr)local_58->okey == tmp) && (local_58->len == skey._4_4_)) &&
               (iVar2 = memcmp(local_58->name,name,(ulong)skey._4_4_), iVar2 == 0)) {
              return local_58->name;
            }
          }
          if ((((xmlDictEntryPtr)local_58->okey == tmp) && (local_58->len == skey._4_4_)) &&
             (iVar2 = memcmp(local_58->name,name,(ulong)skey._4_4_), iVar2 == 0)) {
            return local_58->name;
          }
        }
      }
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlDictExists(xmlDictPtr dict, const xmlChar *name, int len) {
    unsigned long key, okey;
    xmlDictEntryPtr insert;
    unsigned int l;

    if ((dict == NULL) || (name == NULL))
	return(NULL);

    if (len < 0)
        l = strlen((const char *) name);
    else
        l = len;
    if (((dict->limit > 0) && (l >= dict->limit)) ||
        (l > INT_MAX / 2))
        return(NULL);

    /*
     * Check for duplicate and insertion location.
     */
    okey = xmlDictComputeKey(dict, name, l);
    key = okey % dict->size;
    if (dict->dict[key].valid == 0) {
	insert = NULL;
    } else {
	for (insert = &(dict->dict[key]); insert->next != NULL;
	     insert = insert->next) {
#ifdef __GNUC__
	    if ((insert->okey == okey) && (insert->len == l)) {
		if (!memcmp(insert->name, name, l))
		    return(insert->name);
	    }
#else
	    if ((insert->okey == okey) && (insert->len == l) &&
	        (!xmlStrncmp(insert->name, name, l)))
		return(insert->name);
#endif
	}
#ifdef __GNUC__
	if ((insert->okey == okey) && (insert->len == l)) {
	    if (!memcmp(insert->name, name, l))
		return(insert->name);
	}
#else
	if ((insert->okey == okey) && (insert->len == l) &&
	    (!xmlStrncmp(insert->name, name, l)))
	    return(insert->name);
#endif
    }

    if (dict->subdict) {
        unsigned long skey;

        /* we cannot always reuse the same okey for the subdict */
        if (((dict->size == MIN_DICT_SIZE) &&
	     (dict->subdict->size != MIN_DICT_SIZE)) ||
            ((dict->size != MIN_DICT_SIZE) &&
	     (dict->subdict->size == MIN_DICT_SIZE)))
	    skey = xmlDictComputeKey(dict->subdict, name, l);
	else
	    skey = okey;

	key = skey % dict->subdict->size;
	if (dict->subdict->dict[key].valid != 0) {
	    xmlDictEntryPtr tmp;

	    for (tmp = &(dict->subdict->dict[key]); tmp->next != NULL;
		 tmp = tmp->next) {
#ifdef __GNUC__
		if ((tmp->okey == skey) && (tmp->len == l)) {
		    if (!memcmp(tmp->name, name, l))
			return(tmp->name);
		}
#else
		if ((tmp->okey == skey) && (tmp->len == l) &&
		    (!xmlStrncmp(tmp->name, name, l)))
		    return(tmp->name);
#endif
	    }
#ifdef __GNUC__
	    if ((tmp->okey == skey) && (tmp->len == l)) {
		if (!memcmp(tmp->name, name, l))
		    return(tmp->name);
	    }
#else
	    if ((tmp->okey == skey) && (tmp->len == l) &&
		(!xmlStrncmp(tmp->name, name, l)))
		return(tmp->name);
#endif
	}
    }

    /* not found */
    return(NULL);
}